

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  char cVar2;
  char *pcVar3;
  
  conn->transport = '\x04';
  pcVar3 = strstr((data->state).up.path,";mode=");
  if ((pcVar3 == (char *)0x0) &&
     (pcVar3 = strstr((conn->host).rawalloc,";mode="), pcVar3 == (char *)0x0)) {
    return CURLE_OK;
  }
  *pcVar3 = '\0';
  cVar2 = Curl_raw_toupper(pcVar3[6]);
  if ((cVar2 == 'N') || (cVar2 == 'A')) {
    puVar1 = &(data->state).field_0x7bf;
    *puVar1 = *puVar1 | 0x40;
  }
  else {
    puVar1 = &(data->state).field_0x7bf;
    *puVar1 = *puVar1 & 0xbf;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  char *type;

  conn->transport = TRNSPRT_UDP;

  /* TFTP URLs support an extension like ";mode=<typecode>" that
   * we will try to get now! */
  type = strstr(data->state.up.path, ";mode=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";mode=");

  if(type) {
    char command;
    *type = 0;                   /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
    case 'N': /* NETASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'O': /* octet mode */
    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  return CURLE_OK;
}